

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::GetGeometryDescIndex
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  undefined *puVar1;
  bool bVar2;
  Char *Message;
  pointer pvVar3;
  undefined8 uVar4;
  char *in_R8;
  undefined1 local_91;
  undefined1 local_90 [8];
  string _msg;
  HashMapStringKey local_68;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_58;
  const_iterator iter;
  undefined1 local_40 [8];
  string msg;
  char *Name_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[32]>((string *)local_40,(char (*) [32])"Geometry name must not be empty");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetGeometryDescIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x8b);
    std::__cxx11::string::~string((string *)local_40);
  }
  HashMapStringKey::HashMapStringKey(&local_68,(Char *)msg.field_2._8_8_,false);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::find(&this->m_NameToIndex,&local_68);
  HashMapStringKey::~HashMapStringKey(&local_68);
  _msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::end(&this->m_NameToIndex);
  bVar2 = std::__detail::operator!=
                    (&local_58,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                      *)((long)&_msg.field_2 + 8));
  if (bVar2) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                           *)&local_58);
    this_local._4_4_ = (pvVar3->second).IndexInDesc;
  }
  else {
    local_91 = 0x27;
    FormatString<char[32],char_const*,char>
              ((string *)local_90,(Diligent *)"Can\'t find geometry with name \'",
               (char (*) [32])((long)&msg.field_2 + 8),(char **)&local_91,in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar4,0);
    }
    std::__cxx11::string::~string((string *)local_90);
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

GetGeometryDescIndex(const char* Name) const override final
    {
        DEV_CHECK_ERR(Name != nullptr && Name[0] != '\0', "Geometry name must not be empty");

        auto iter = m_NameToIndex.find(Name);
        if (iter != m_NameToIndex.end())
            return iter->second.IndexInDesc;

        LOG_ERROR_MESSAGE("Can't find geometry with name '", Name, '\'');
        return INVALID_INDEX;
    }